

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O0

idx_t __thiscall duckdb::SingleFileBlockManager::FreeBlocks(SingleFileBlockManager *this)

{
  size_type sVar1;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  
  ::std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  sVar1 = ::std::set<long,_std::less<long>,_std::allocator<long>_>::size
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)0xc5f655);
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xc5f664);
  return sVar1;
}

Assistant:

idx_t SingleFileBlockManager::FreeBlocks() {
	lock_guard<mutex> lock(block_lock);
	return free_list.size();
}